

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O0

void __thiscall Assimp::D3DS::Material::Material(Material *this,string *name)

{
  string *name_local;
  Material *this_local;
  
  this->_vptr_Material = (_func_int **)&PTR__Material_00f3fd38;
  std::__cxx11::string::string((string *)&this->mName,(string *)name);
  aiColor3D::aiColor3D(&this->mDiffuse,0.6,0.6,0.6);
  this->mSpecularExponent = 0.0;
  this->mShininessStrength = 1.0;
  aiColor3D::aiColor3D(&this->mSpecular);
  aiColor3D::aiColor3D(&this->mAmbient);
  this->mShading = Gouraud;
  this->mTransparency = 1.0;
  Texture::Texture(&this->sTexDiffuse);
  Texture::Texture(&this->sTexOpacity);
  Texture::Texture(&this->sTexSpecular);
  Texture::Texture(&this->sTexReflective);
  Texture::Texture(&this->sTexBump);
  Texture::Texture(&this->sTexEmissive);
  Texture::Texture(&this->sTexShininess);
  this->mBumpHeight = 1.0;
  aiColor3D::aiColor3D(&this->mEmissive);
  Texture::Texture(&this->sTexAmbient);
  this->mTwoSided = false;
  return;
}

Assistant:

explicit Material(const std::string &name)
    : mName(name)
    , mDiffuse            ( ai_real( 0.6 ), ai_real( 0.6 ), ai_real( 0.6 ) ) // FIX ... we won't want object to be black
    , mSpecularExponent   ( ai_real( 0.0 ) )
    , mShininessStrength  ( ai_real( 1.0 ) )
    , mShading(Discreet3DS::Gouraud)
    , mTransparency       ( ai_real( 1.0 ) )
    , mBumpHeight         ( ai_real( 1.0 ) )
    , mTwoSided           (false)
    {
    }